

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O1

void Amap_ManMergeNodeCutsMux(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  Vec_Int_t *pVVar1;
  void **ppvVar2;
  Amap_Obj_t *pFanin;
  Amap_Obj_t *pFanin_00;
  Amap_Obj_t *pFanin_01;
  Amap_Cut_t *pCut0;
  Amap_Cut_t *pCut1;
  int *piVar3;
  Amap_Cut_t *pCut2;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  char *__function;
  uint uVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  ulong uVar11;
  char *__file;
  char *__assertion;
  ulong uVar12;
  long local_70;
  long local_68;
  
  uVar8 = pNode->Fan[0];
  if ((int)uVar8 < 0) {
LAB_003b25b9:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  iVar6 = p->vObjs->nSize;
  if ((int)(uVar8 >> 1) < iVar6) {
    uVar4 = pNode->Fan[1];
    if ((int)uVar4 < 0) goto LAB_003b25b9;
    if ((int)(uVar4 >> 1) < iVar6) {
      uVar5 = pNode->Fan[2];
      if ((int)uVar5 < 0) goto LAB_003b25b9;
      if ((int)(uVar5 >> 1) < iVar6) {
        if ((pNode->field_11).pData == (void *)0x0) {
          if (((uint)*(ulong *)pNode & 7) != 6) {
            __assert_fail("pNode->Type == AMAP_OBJ_MUX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                          ,0x185,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
          }
          if ((*(ulong *)pNode >> 0x3e & 1) != 0) {
            __assert_fail("pNode->fRepr == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                          ,0x186,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
          }
          pVVar1 = p->pLib->vRules3;
          ppvVar2 = p->vObjs->pArray;
          pFanin = (Amap_Obj_t *)ppvVar2[uVar8 >> 1];
          pFanin_00 = (Amap_Obj_t *)ppvVar2[uVar4 >> 1];
          pFanin_01 = (Amap_Obj_t *)ppvVar2[uVar5 >> 1];
          if (0 < pVVar1->nSize) {
            uVar8 = uVar8 & 1;
            uVar4 = uVar4 & 1;
            uVar5 = uVar5 & 1;
            uVar11 = 0;
            do {
              iVar6 = Amap_ManFindCut((Amap_Obj_t *)p,pFanin,uVar8,pVVar1->pArray[uVar11],p->vCuts0)
              ;
              if (iVar6 == 0) {
                if ((long)pVVar1->nSize <= (long)(uVar11 | 1)) {
LAB_003b257b:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar6 = Amap_ManFindCut((Amap_Obj_t *)p,pFanin_00,uVar4,pVVar1->pArray[uVar11 | 1],
                                        p->vCuts1);
                if (iVar6 == 0) {
                  if ((long)pVVar1->nSize <= (long)(uVar11 | 2)) goto LAB_003b257b;
                  iVar6 = Amap_ManFindCut((Amap_Obj_t *)p,pFanin_01,uVar5,pVVar1->pArray[uVar11 | 2]
                                          ,p->vCuts2);
                  if ((iVar6 == 0) && (pVVar7 = p->vCuts0, 0 < pVVar7->nSize)) {
                    uVar12 = uVar11 | 3;
                    local_70 = 0;
                    do {
                      pVVar9 = p->vCuts1;
                      if (0 < pVVar9->nSize) {
                        pCut0 = (Amap_Cut_t *)pVVar7->pArray[local_70];
                        local_68 = 0;
                        do {
                          pVVar7 = p->vCuts2;
                          if (0 < pVVar7->nSize) {
                            pCut1 = (Amap_Cut_t *)pVVar9->pArray[local_68];
                            lVar10 = 0;
                            do {
                              if ((long)pVVar1->nSize <= (long)uVar12) goto LAB_003b257b;
                              piVar3 = pVVar1->pArray;
                              if (p->pLib->pNodes[piVar3[uVar12]].pSets != (Amap_Set_t *)0x0) {
                                pCut2 = (Amap_Cut_t *)pVVar7->pArray[lVar10];
                                if ((((uint)*pCut0 & 0xfffe0000) == 0x20000) &&
                                   (((uint)*pCut0 >> 0x10 & 1) != uVar8)) {
                                  if ((int)pCut0[1] < 0) goto LAB_003b259a;
                                  pCut0[1] = (Amap_Cut_t)((uint)pCut0[1] ^ 1);
                                }
                                if ((((uint)*pCut1 & 0xfffe0000) == 0x20000) &&
                                   (((uint)*pCut1 >> 0x10 & 1) != uVar4)) {
                                  if ((int)pCut1[1] < 0) goto LAB_003b259a;
                                  pCut1[1] = (Amap_Cut_t)((uint)pCut1[1] ^ 1);
                                }
                                if ((((uint)*pCut2 & 0xfffe0000) == 0x20000) &&
                                   (((uint)*pCut2 >> 0x10 & 1) != uVar5)) {
                                  if ((int)pCut2[1] < 0) goto LAB_003b259a;
                                  pCut2[1] = (Amap_Cut_t)((uint)pCut2[1] ^ 1);
                                }
                                if ((long)pVVar1->nSize <= (long)uVar12) goto LAB_003b257b;
                                Amap_ManCutCreate3(p,pCut0,pCut1,pCut2,piVar3[uVar12]);
                                if ((((uint)*pCut0 & 0xfffe0000) == 0x20000) &&
                                   (((uint)*pCut0 >> 0x10 & 1) != uVar8)) {
                                  if ((int)pCut0[1] < 0) goto LAB_003b259a;
                                  pCut0[1] = (Amap_Cut_t)((uint)pCut0[1] ^ 1);
                                }
                                if ((((uint)*pCut1 & 0xfffe0000) == 0x20000) &&
                                   (((uint)*pCut1 >> 0x10 & 1) != uVar4)) {
                                  if ((int)pCut1[1] < 0) goto LAB_003b259a;
                                  pCut1[1] = (Amap_Cut_t)((uint)pCut1[1] ^ 1);
                                }
                                if ((((uint)*pCut2 & 0xfffe0000) == 0x20000) &&
                                   (((uint)*pCut2 >> 0x10 & 1) != uVar5)) {
                                  if ((int)pCut2[1] < 0) {
LAB_003b259a:
                                    __assert_fail("Lit >= 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                                  ,0x10e,"int Abc_LitNot(int)");
                                  }
                                  pCut2[1] = (Amap_Cut_t)((uint)pCut2[1] ^ 1);
                                }
                              }
                              lVar10 = lVar10 + 1;
                              pVVar7 = p->vCuts2;
                            } while (lVar10 < pVVar7->nSize);
                          }
                          local_68 = local_68 + 1;
                          pVVar9 = p->vCuts1;
                        } while (local_68 < pVVar9->nSize);
                      }
                      local_70 = local_70 + 1;
                      pVVar7 = p->vCuts0;
                    } while (local_70 < pVVar7->nSize);
                  }
                }
              }
              uVar11 = uVar11 + 4;
            } while ((int)uVar11 < pVVar1->nSize);
          }
          Amap_ManCutSaveStored(p,pNode);
          p->nCutsUsed = p->nCutsUsed + (*(uint *)&pNode->field_0x8 >> 0xc);
          p->nCutsTried3 =
               p->nCutsTried3 +
               (*(uint *)&pFanin_01->field_0x8 >> 0xc) *
               (*(uint *)&pFanin_00->field_0x8 >> 0xc) * (*(uint *)&pFanin->field_0x8 >> 0xc);
          return;
        }
        __assertion = "pNode->pData == NULL";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
        ;
        __function = "void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)";
        goto LAB_003b2604;
      }
    }
  }
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h";
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_003b2604:
  __assert_fail(__assertion,__file,0x184,__function);
}

Assistant:

void Amap_ManMergeNodeCutsMux( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Vec_Int_t * vRules = p->pLib->vRules3;
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Obj_t * pFanin2 = Amap_ObjFanin2( p, pNode );
    int fComplFanin0 = Amap_ObjFaninC0( pNode );
    int fComplFanin1 = Amap_ObjFaninC1( pNode );
    int fComplFanin2 = Amap_ObjFaninC2( pNode );
    Amap_Cut_t * pCut0, * pCut1, * pCut2;
    int x, c0, c1, c2;
    assert( pNode->pData == NULL );
    assert( pNode->Type == AMAP_OBJ_MUX );
    assert( pNode->fRepr == 0 );
    // go through the rules
    for ( x = 0; x < Vec_IntSize(vRules); x += 4 )
    {
        if ( Amap_ManFindCut( pNode, pFanin0, fComplFanin0, Vec_IntEntry(vRules, x), p->vCuts0 ) )
            continue;
        if ( Amap_ManFindCut( pNode, pFanin1, fComplFanin1, Vec_IntEntry(vRules, x+1), p->vCuts1 ) )
            continue;
        if ( Amap_ManFindCut( pNode, pFanin2, fComplFanin2, Vec_IntEntry(vRules, x+2), p->vCuts2 ) )
            continue;
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts0, pCut0, c0 )
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts1, pCut1, c1 )
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts2, pCut2, c2 )
        {
            Amap_Nod_t * pNod = Amap_LibNod( p->pLib, Vec_IntEntry(vRules, x+3) );
            if ( pNod->pSets == NULL )
                continue;
            // complement literals
            if ( pCut0->nFans == 1 && (pCut0->fInv ^ fComplFanin0) )
                pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
            if ( pCut1->nFans == 1 && (pCut1->fInv ^ fComplFanin1) )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            if ( pCut2->nFans == 1 && (pCut2->fInv ^ fComplFanin2) )
                pCut2->Fans[0] = Abc_LitNot(pCut2->Fans[0]);
            // create new cut
            Amap_ManCutCreate3( p, pCut0, pCut1, pCut2, Vec_IntEntry(vRules, x+3) );
            // uncomplement literals
            if ( pCut0->nFans == 1 && (pCut0->fInv ^ fComplFanin0) )
                pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
            if ( pCut1->nFans == 1 && (pCut1->fInv ^ fComplFanin1) )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            if ( pCut2->nFans == 1 && (pCut2->fInv ^ fComplFanin2) )
                pCut2->Fans[0] = Abc_LitNot(pCut2->Fans[0]);
        }
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried3 += pFanin0->nCuts * pFanin1->nCuts * pFanin2->nCuts;

//    Amap_ManPrintCuts( pNode );
}